

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

bool __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::set(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,string *value)

{
  string local_30 [32];
  
  (*(this->super_option_base)._vptr_option_base[0xc])(local_30,this,value);
  std::__cxx11::string::operator=((string *)&this->actual,local_30);
  std::__cxx11::string::~string(local_30);
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value)
			{
				try
				{
					actual = read(value);
					has = true;
				}
				catch(const std::exception &)
				{
					return false;
				}
				return true;
			}